

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall
shaping_clipper::limit_clip_spectrum(shaping_clipper *this,float *clip_spectrum,float *mask_curve)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 extraout_XMM0_Db;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  fVar5 = ABS(*clip_spectrum) / *mask_curve;
  if (1.0 < fVar5) {
    *clip_spectrum = *clip_spectrum / fVar5;
  }
  uVar3 = (this->oversample * this->size) / 2;
  uVar1 = this->size / 2;
  if ((int)(uVar1 + 1) < (int)uVar3) {
    uVar3 = uVar1 + 1;
  }
  uVar2 = 1;
  if (1 < (int)uVar3) {
    uVar4 = 1;
    do {
      fVar5 = cabsf((float)*(undefined8 *)(clip_spectrum + uVar4 * 2));
      fVar5 = (fVar5 + fVar5) / mask_curve[uVar4];
      if (1.0 < fVar5) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(clip_spectrum + uVar4 * 2);
        auVar7._4_4_ = fVar5;
        auVar7._0_4_ = fVar5;
        auVar7._8_4_ = extraout_XMM0_Db;
        auVar7._12_4_ = extraout_XMM0_Db;
        auVar7 = divps(auVar6,auVar7);
        *(long *)(clip_spectrum + uVar4 * 2) = auVar7._0_8_;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar1 = this->size / 2;
    uVar2 = uVar3;
  }
  if (uVar2 == uVar1) {
    fVar5 = ABS(clip_spectrum[1]) / mask_curve[uVar2];
    if (1.0 < fVar5) {
      clip_spectrum[1] = clip_spectrum[1] / fVar5;
    }
  }
  return;
}

Assistant:

void shaping_clipper::limit_clip_spectrum(float* clip_spectrum, const float* mask_curve) {
    // bin 0
    float relative_distortion_level = std::abs(clip_spectrum[0]) / mask_curve[0];
    if (relative_distortion_level > 1.0) {
        clip_spectrum[0] /= relative_distortion_level;
    }
    // bin 1..N/2-1
    // When oversampling is on, the base nyquist bin is handled in this loop
    int i = 1;
    int bins_below_nyquist = std::min(this->size * this->oversample / 2, this->size / 2 + 1);
    for (; i < bins_below_nyquist; i++) {
        float real = clip_spectrum[i * 2];
        float imag = clip_spectrum[i * 2 + 1];
        // although the negative frequencies are omitted because they are redundant,
        // the magnitude of the positive frequencies are not doubled.
        // Multiply the magnitude by 2 to simulate adding up the + and - frequencies.
        relative_distortion_level = abs(std::complex<float>(real, imag)) * 2 / mask_curve[i];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[i * 2] /= relative_distortion_level;
            clip_spectrum[i * 2 + 1] /= relative_distortion_level;
        }
    }
    // bin N/2
    // When oversampling is off, the base nyquist bins needs to be handled here.
    if (i == this->size / 2) {
        relative_distortion_level = std::abs(clip_spectrum[1]) / mask_curve[this->size / 2];
        if (relative_distortion_level > 1.0) {
            clip_spectrum[1] /= relative_distortion_level;
        }
    }
}